

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64-gen.c
# Opt level: O2

void orex(int ll,int r,int r2,int b)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = ~r & 0x30U;
  if ((~r & 0x30U) != 0) {
    uVar1 = r;
  }
  uVar2 = ~r2 & 0x30U;
  if ((~r2 & 0x30U) != 0) {
    uVar2 = r2;
  }
  if (((uVar2 | uVar1) & 8) != 0 || ll != 0) {
    o((uVar2 >> 1 & 4 | uVar1 >> 3 & 1) + ll * 8 | 0x40);
  }
  o(b);
  return;
}

Assistant:

static void orex(int ll, int r, int r2, int b) {
  if ((r & VT_VALMASK) >= VT_CONST)
    r = 0;
  if ((r2 & VT_VALMASK) >= VT_CONST)
    r2 = 0;
  if (ll || REX_BASE(r) || REX_BASE(r2))
    o(0x40 | REX_BASE(r) | (REX_BASE(r2) << 2) | (ll << 3));
  o(b);
}